

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O2

void __thiscall
helics::HandleManager::addSearchFields(HandleManager *this,BasicHandleInfo *handle,int32_t index)

{
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>_>
  *__ht;
  InterfaceType IVar1;
  size_type sVar2;
  pointer pcVar3;
  AliasT aliases;
  AliasT aliases_00;
  AliasT aliases_01;
  AliasT aliases_02;
  AliasT aliases_03;
  AliasT aliases_04;
  AliasT aliases_05;
  AliasT aliases_06;
  AliasT aliases_07;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  string_view typeName;
  string_view typeName_00;
  string_view typeName_01;
  string_view typeName_02;
  string_view typeName_03;
  string_view typeName_04;
  string_view typeName_05;
  string_view typeName_06;
  string_view typeName_07;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  string_view key_07;
  undefined8 uStack_250;
  undefined8 local_240;
  undefined4 uStack_238;
  int32_t index_local;
  undefined8 local_230;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_228;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1f0;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1b8;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_180;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_148;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_110;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_d8;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_a0;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  sVar2 = (handle->key)._M_string_length;
  index_local = index;
  if (sVar2 != 0) {
    IVar1 = handle->handleType;
    if (IVar1 == TRANSLATOR) {
      pcVar3 = (handle->key)._M_dataplus._M_p;
      __ht = &this->aliases;
      std::
      _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable(&local_148,&__ht->_M_h);
      aliases_05._M_h._M_bucket_count = uStack_250;
      aliases_05._M_h._M_buckets = (__buckets_ptr)&local_148;
      aliases_05._M_h._M_before_begin._M_nxt = (_Hash_node_base *)__ht;
      aliases_05._M_h._M_element_count = (size_type)&this->publications;
      aliases_05._M_h._M_rehash_policy._M_max_load_factor = (float)uStack_238;
      aliases_05._M_h._M_rehash_policy._4_4_ = index_local;
      aliases_05._M_h._M_rehash_policy._M_next_resize = local_230;
      aliases_05._M_h._M_single_bucket = (__node_base_ptr)local_228._M_buckets;
      typeName_05._M_str = "publication";
      typeName_05._M_len = 0xb;
      key_05._M_str = pcVar3;
      key_05._M_len = sVar2;
      addFields(key_05,typeName_05,(InterfaceHandle)index,&this->publications,aliases_05);
      std::
      _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_148);
      pcVar3 = (handle->key)._M_dataplus._M_p;
      sVar2 = (handle->key)._M_string_length;
      std::
      _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable(&local_180,&__ht->_M_h);
      aliases_06._M_h._M_bucket_count = uStack_250;
      aliases_06._M_h._M_buckets = (__buckets_ptr)&local_180;
      aliases_06._M_h._M_before_begin._M_nxt = (_Hash_node_base *)__ht;
      aliases_06._M_h._M_element_count = (size_type)&this->endpoints;
      aliases_06._M_h._M_rehash_policy._M_max_load_factor = (float)uStack_238;
      aliases_06._M_h._M_rehash_policy._4_4_ = index_local;
      aliases_06._M_h._M_rehash_policy._M_next_resize = local_230;
      aliases_06._M_h._M_single_bucket = (__node_base_ptr)local_228._M_buckets;
      typeName_06._M_str = "endpoint";
      typeName_06._M_len = 8;
      key_06._M_str = pcVar3;
      key_06._M_len = sVar2;
      addFields(key_06,typeName_06,(InterfaceHandle)index,&this->endpoints,aliases_06);
      std::
      _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_180);
      pcVar3 = (handle->key)._M_dataplus._M_p;
      sVar2 = (handle->key)._M_string_length;
      this_00 = &local_1b8;
      std::
      _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable(this_00,&__ht->_M_h);
      aliases_07._M_h._M_bucket_count = uStack_250;
      aliases_07._M_h._M_buckets = (__buckets_ptr)this_00;
      aliases_07._M_h._M_before_begin._M_nxt = (_Hash_node_base *)__ht;
      aliases_07._M_h._M_element_count = (size_type)&this->inputs;
      aliases_07._M_h._M_rehash_policy._M_max_load_factor = (float)uStack_238;
      aliases_07._M_h._M_rehash_policy._4_4_ = index_local;
      aliases_07._M_h._M_rehash_policy._M_next_resize = local_230;
      aliases_07._M_h._M_single_bucket = (__node_base_ptr)local_228._M_buckets;
      typeName_07._M_str = "input";
      typeName_07._M_len = 5;
      key_07._M_str = pcVar3;
      key_07._M_len = sVar2;
      addFields(key_07,typeName_07,(InterfaceHandle)index,&this->inputs,aliases_07);
    }
    else if (IVar1 == FILTER) {
      pcVar3 = (handle->key)._M_dataplus._M_p;
      this_00 = &local_d8;
      std::
      _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable(this_00,&(this->aliases)._M_h);
      aliases_04._M_h._M_bucket_count = uStack_250;
      aliases_04._M_h._M_buckets = (__buckets_ptr)this_00;
      aliases_04._M_h._M_before_begin._M_nxt = (_Hash_node_base *)&this->filters;
      aliases_04._M_h._M_element_count = local_240;
      aliases_04._M_h._M_rehash_policy._M_max_load_factor = (float)uStack_238;
      aliases_04._M_h._M_rehash_policy._4_4_ = index_local;
      aliases_04._M_h._M_rehash_policy._M_next_resize = local_230;
      aliases_04._M_h._M_single_bucket = (__node_base_ptr)local_228._M_buckets;
      typeName_04._M_str = "filter";
      typeName_04._M_len = 6;
      key_04._M_str = pcVar3;
      key_04._M_len = sVar2;
      addFields(key_04,typeName_04,(InterfaceHandle)index,&this->filters,aliases_04);
    }
    else if (IVar1 == INPUT) {
      pcVar3 = (handle->key)._M_dataplus._M_p;
      this_00 = &local_110;
      std::
      _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable(this_00,&(this->aliases)._M_h);
      aliases_00._M_h._M_bucket_count = uStack_250;
      aliases_00._M_h._M_buckets = (__buckets_ptr)this_00;
      aliases_00._M_h._M_before_begin._M_nxt = (_Hash_node_base *)&this->inputs;
      aliases_00._M_h._M_element_count = local_240;
      aliases_00._M_h._M_rehash_policy._M_max_load_factor = (float)uStack_238;
      aliases_00._M_h._M_rehash_policy._4_4_ = index_local;
      aliases_00._M_h._M_rehash_policy._M_next_resize = local_230;
      aliases_00._M_h._M_single_bucket = (__node_base_ptr)local_228._M_buckets;
      typeName_00._M_str = "input";
      typeName_00._M_len = 5;
      key_00._M_str = pcVar3;
      key_00._M_len = sVar2;
      addFields(key_00,typeName_00,(InterfaceHandle)index,&this->inputs,aliases_00);
    }
    else if (IVar1 == PUBLICATION) {
      pcVar3 = (handle->key)._M_dataplus._M_p;
      this_00 = &local_a0;
      std::
      _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable(this_00,&(this->aliases)._M_h);
      aliases_03._M_h._M_bucket_count = uStack_250;
      aliases_03._M_h._M_buckets = (__buckets_ptr)this_00;
      aliases_03._M_h._M_before_begin._M_nxt = (_Hash_node_base *)&this->publications;
      aliases_03._M_h._M_element_count = local_240;
      aliases_03._M_h._M_rehash_policy._M_max_load_factor = (float)uStack_238;
      aliases_03._M_h._M_rehash_policy._4_4_ = index_local;
      aliases_03._M_h._M_rehash_policy._M_next_resize = local_230;
      aliases_03._M_h._M_single_bucket = (__node_base_ptr)local_228._M_buckets;
      typeName_03._M_str = "publication";
      typeName_03._M_len = 0xb;
      key_03._M_str = pcVar3;
      key_03._M_len = sVar2;
      addFields(key_03,typeName_03,(InterfaceHandle)index,&this->publications,aliases_03);
    }
    else if (IVar1 == SINK) {
      pcVar3 = (handle->key)._M_dataplus._M_p;
      std::
      _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable(&local_1f0,&(this->aliases)._M_h);
      aliases_01._M_h._M_bucket_count = uStack_250;
      aliases_01._M_h._M_buckets = (__buckets_ptr)&local_1f0;
      aliases_01._M_h._M_before_begin._M_nxt = (_Hash_node_base *)&this->endpoints;
      aliases_01._M_h._M_element_count = (size_type)pcVar3;
      aliases_01._M_h._M_rehash_policy._M_max_load_factor = (float)uStack_238;
      aliases_01._M_h._M_rehash_policy._4_4_ = index_local;
      aliases_01._M_h._M_rehash_policy._M_next_resize = local_230;
      aliases_01._M_h._M_single_bucket = (__node_base_ptr)local_228._M_buckets;
      typeName_01._M_str = "endpoint";
      typeName_01._M_len = 8;
      key_01._M_str = pcVar3;
      key_01._M_len = sVar2;
      addFields(key_01,typeName_01,(InterfaceHandle)index,&this->endpoints,aliases_01);
      std::
      _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_1f0);
      pcVar3 = (handle->key)._M_dataplus._M_p;
      sVar2 = (handle->key)._M_string_length;
      this_00 = &local_228;
      std::
      _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable(this_00,&(this->aliases)._M_h);
      aliases_02._M_h._M_bucket_count = uStack_250;
      aliases_02._M_h._M_buckets = (__buckets_ptr)this_00;
      aliases_02._M_h._M_before_begin._M_nxt = (_Hash_node_base *)&this->inputs;
      aliases_02._M_h._M_element_count = (size_type)pcVar3;
      aliases_02._M_h._M_rehash_policy._M_max_load_factor = (float)uStack_238;
      aliases_02._M_h._M_rehash_policy._4_4_ = index_local;
      aliases_02._M_h._M_rehash_policy._M_next_resize = local_230;
      aliases_02._M_h._M_single_bucket = (__node_base_ptr)local_228._M_buckets;
      typeName_02._M_str = "input";
      typeName_02._M_len = 5;
      key_02._M_str = pcVar3;
      key_02._M_len = sVar2;
      addFields(key_02,typeName_02,(InterfaceHandle)index,&this->inputs,aliases_02);
    }
    else {
      if (IVar1 != ENDPOINT) goto LAB_002da078;
      pcVar3 = (handle->key)._M_dataplus._M_p;
      this_00 = &local_68;
      std::
      _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable(this_00,&(this->aliases)._M_h);
      aliases._M_h._M_bucket_count = uStack_250;
      aliases._M_h._M_buckets = (__buckets_ptr)this_00;
      aliases._M_h._M_before_begin._M_nxt = (_Hash_node_base *)&this->endpoints;
      aliases._M_h._M_element_count = local_240;
      aliases._M_h._M_rehash_policy._M_max_load_factor = (float)uStack_238;
      aliases._M_h._M_rehash_policy._4_4_ = index_local;
      aliases._M_h._M_rehash_policy._M_next_resize = local_230;
      aliases._M_h._M_single_bucket = (__node_base_ptr)local_228._M_buckets;
      typeName._M_str = "endpoint";
      typeName._M_len = 8;
      key._M_str = pcVar3;
      key._M_len = sVar2;
      addFields(key,typeName,(InterfaceHandle)index,&this->endpoints,aliases);
    }
    std::
    _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(this_00);
  }
LAB_002da078:
  local_230 = CONCAT44((handle->handle).fed_id.gid,(handle->handle).handle.hid);
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,int>,std::allocator<std::pair<unsigned_long_const,int>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<unsigned_long,int&>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,int>,std::allocator<std::pair<unsigned_long_const,int>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->unique_ids,&local_230,&index_local);
  return;
}

Assistant:

void HandleManager::addSearchFields(const BasicHandleInfo& handle, int32_t index)
{
    if (!handle.key.empty()) {
        switch (handle.handleType) {
            case InterfaceType::ENDPOINT:
                addFields(handle.key, "endpoint", InterfaceHandle(index), endpoints, aliases);
                break;
            case InterfaceType::PUBLICATION:
                addFields(handle.key, "publication", InterfaceHandle(index), publications, aliases);
                break;
            case InterfaceType::FILTER:
                addFields(handle.key, "filter", InterfaceHandle(index), filters, aliases);
                break;
            case InterfaceType::INPUT:
                addFields(handle.key, "input", InterfaceHandle(index), inputs, aliases);
                break;
            case InterfaceType::TRANSLATOR:
                addFields(handle.key, "publication", InterfaceHandle(index), publications, aliases);
                addFields(handle.key, "endpoint", InterfaceHandle(index), endpoints, aliases);
                addFields(handle.key, "input", InterfaceHandle(index), inputs, aliases);
                break;
            case InterfaceType::SINK:
                addFields(handle.key, "endpoint", InterfaceHandle(index), endpoints, aliases);
                addFields(handle.key, "input", InterfaceHandle(index), inputs, aliases);
                break;
            default:
                break;
        }
    }
    // generate a key of the fed and handle
    unique_ids.emplace(static_cast<uint64_t>(handle.handle), index);
}